

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O1

Error asmjit::X86Internal::initCallConv(CallConv *cc,uint32_t ccId)

{
  undefined4 uVar1;
  Error EVar2;
  byte bVar3;
  long lVar4;
  uint32_t uVar5;
  
  EVar2 = 3;
  switch(ccId) {
  case 0x10:
    break;
  case 0x11:
    cc->_flags = '\x01';
    break;
  case 0x12:
    cc->_flags = '\x01';
    cc->_passedOrder[0] = (RegOrder)0xffffffffffffff01;
    cc->_passedRegs[0] = 2;
    break;
  case 0x13:
  case 0x14:
    cc->_flags = '\x01';
    cc->_passedOrder[0] = (RegOrder)0xffffffffffff0201;
    cc->_passedRegs[0] = 6;
    break;
  case 0x15:
    cc->_passedOrder[0] = (RegOrder)0xffffffffffffff00;
    cc->_passedRegs[0] = 1;
    break;
  case 0x16:
    cc->_passedOrder[0] = (RegOrder)0xffffffffffff0200;
    cc->_passedRegs[0] = 5;
    break;
  case 0x17:
    cc->_passedOrder[0] = (RegOrder)0xffffffffff010200;
    cc->_passedRegs[0] = 7;
    break;
  default:
    goto switchD_00121d73_caseD_18;
  case 0x1d:
  case 0x1e:
  case 0x1f:
    cc->_archType = '\x01';
    cc->_flags = '\x02';
    cc->_naturalStackAlignment = '\x10';
    cc->_passedRegs[0] = 199;
    cc->_passedOrder[2] = (RegOrder)0x706050403020100;
    cc->_passedOrder[0] = (RegOrder)0xffffff0706010200;
    cc->_passedOrder[1] = (RegOrder)0x706050403020100;
    cc->_passedRegs[1] = 0xff;
    cc->_passedRegs[2] = 0xff;
    bVar3 = (byte)(ccId - 0x1d);
    uVar5 = 0;
    if (ccId - 0x1d < 0x20) {
      uVar5 = (0xffU >> (bVar3 & 0x1f)) << (bVar3 & 0x1f);
    }
    cc->_preservedRegs[0] = 0xff;
    cc->_preservedRegs[1] = uVar5;
    cc->_preservedRegs[2] = 0xff;
    goto LAB_00121e34;
  case 0x20:
    cc->_archType = '\x02';
    cc->_algorithm = '\x01';
    cc->_flags = '\n';
    cc->_naturalStackAlignment = '\x10';
    cc->_spillZoneSize = ' ';
    cc->_passedRegs[0] = 0x306;
    cc->_passedRegs[1] = 0xf;
    cc->_passedOrder[0] = (RegOrder)0xffffffff09080201;
    cc->_passedOrder[1] = (RegOrder)0xffffffff03020100;
    cc->_preservedRegs[0] = 0xf0f8;
    uVar1 = 0xffc0;
    lVar4 = 0x3c;
    goto LAB_00121f1e;
  case 0x21:
    cc->_archType = '\x02';
    cc->_flags = '\x02';
    cc->_naturalStackAlignment = '\x10';
    cc->_redZoneSize = 0x80;
    cc->_passedRegs[0] = 0x3c6;
    cc->_passedRegs[1] = 0xff;
    cc->_passedOrder[0] = (RegOrder)0xffff090801020607;
    cc->_passedOrder[1] = (RegOrder)0x706050403020100;
    uVar1 = 0xf038;
    goto LAB_00121f19;
  case 0x2d:
  case 0x2e:
  case 0x2f:
    cc->_archType = '\x02';
    cc->_flags = '\x02';
    cc->_naturalStackAlignment = '\x10';
    cc->_passedRegs[0] = 199;
    cc->_passedOrder[2] = (RegOrder)0x706050403020100;
    cc->_passedOrder[0] = (RegOrder)0xffffff0706010200;
    cc->_passedOrder[1] = (RegOrder)0x706050403020100;
    cc->_passedRegs[1] = 0xff;
    cc->_passedRegs[2] = 0xff;
    cc->_preservedRegs[0] = 0xffff;
    uVar5 = 0;
    if (ccId - 0x2d < 0x20) {
      uVar5 = -1 << ((byte)(ccId - 0x2d) & 0x1f);
    }
    cc->_preservedRegs[1] = uVar5;
    cc->_preservedRegs[2] = 0xff;
LAB_00121e34:
    uVar1 = 0xff;
    lVar4 = 0x44;
    goto LAB_00121f1e;
  }
  cc->_naturalStackAlignment = '\x04';
  cc->_archType = '\x01';
  uVar1 = 0xf8;
LAB_00121f19:
  lVar4 = 0x38;
LAB_00121f1e:
  *(undefined4 *)((long)cc->_passedOrder + lVar4 + -8) = uVar1;
  cc->_id = (uint8_t)ccId;
  EVar2 = 0;
switchD_00121d73_caseD_18:
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::initCallConv(CallConv& cc, uint32_t ccId) noexcept {
  const uint32_t kKindGp  = X86Reg::kKindGp;
  const uint32_t kKindVec = X86Reg::kKindVec;
  const uint32_t kKindMm  = X86Reg::kKindMm;
  const uint32_t kKindK   = X86Reg::kKindK;

  const uint32_t kZax = X86Gp::kIdAx;
  const uint32_t kZbx = X86Gp::kIdBx;
  const uint32_t kZcx = X86Gp::kIdCx;
  const uint32_t kZdx = X86Gp::kIdDx;
  const uint32_t kZsp = X86Gp::kIdSp;
  const uint32_t kZbp = X86Gp::kIdBp;
  const uint32_t kZsi = X86Gp::kIdSi;
  const uint32_t kZdi = X86Gp::kIdDi;

  switch (ccId) {
    case CallConv::kIdX86StdCall:
      cc.setFlags(CallConv::kFlagCalleePopsStack);
      goto X86CallConv;

    case CallConv::kIdX86MsThisCall:
      cc.setFlags(CallConv::kFlagCalleePopsStack);
      cc.setPassedOrder(kKindGp, kZcx);
      goto X86CallConv;

    case CallConv::kIdX86MsFastCall:
    case CallConv::kIdX86GccFastCall:
      cc.setFlags(CallConv::kFlagCalleePopsStack);
      cc.setPassedOrder(kKindGp, kZcx, kZdx);
      goto X86CallConv;

    case CallConv::kIdX86GccRegParm1:
      cc.setPassedOrder(kKindGp, kZax);
      goto X86CallConv;

    case CallConv::kIdX86GccRegParm2:
      cc.setPassedOrder(kKindGp, kZax, kZdx);
      goto X86CallConv;

    case CallConv::kIdX86GccRegParm3:
      cc.setPassedOrder(kKindGp, kZax, kZdx, kZcx);
      goto X86CallConv;

    case CallConv::kIdX86CDecl:
X86CallConv:
      cc.setNaturalStackAlignment(4);
      cc.setArchType(ArchInfo::kTypeX86);
      cc.setPreservedRegs(kKindGp, Utils::mask(kZbx, kZsp, kZbp, kZsi, kZdi));
      break;

    case CallConv::kIdX86Win64:
      cc.setArchType(ArchInfo::kTypeX64);
      cc.setAlgorithm(CallConv::kAlgorithmWin64);
      cc.setFlags(CallConv::kFlagPassFloatsByVec | CallConv::kFlagIndirectVecArgs);
      cc.setNaturalStackAlignment(16);
      cc.setSpillZoneSize(32);
      cc.setPassedOrder(kKindGp, kZcx, kZdx, 8, 9);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3);
      cc.setPreservedRegs(kKindGp, Utils::mask(kZbx, kZsp, kZbp, kZsi, kZdi, 12, 13, 14, 15));
      cc.setPreservedRegs(kKindVec, Utils::mask(6, 7, 8, 9, 10, 11, 12, 13, 14, 15));
      break;

    case CallConv::kIdX86SysV64:
      cc.setArchType(ArchInfo::kTypeX64);
      cc.setFlags(CallConv::kFlagPassFloatsByVec);
      cc.setNaturalStackAlignment(16);
      cc.setRedZoneSize(128);
      cc.setPassedOrder(kKindGp, kZdi, kZsi, kZdx, kZcx, 8, 9);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3, 4, 5, 6, 7);
      cc.setPreservedRegs(kKindGp, Utils::mask(kZbx, kZsp, kZbp, 12, 13, 14, 15));
      break;

    case CallConv::kIdX86FastEval2:
    case CallConv::kIdX86FastEval3:
    case CallConv::kIdX86FastEval4: {
      uint32_t n = ccId - CallConv::kIdX86FastEval2;

      cc.setArchType(ArchInfo::kTypeX86);
      cc.setFlags(CallConv::kFlagPassFloatsByVec);
      cc.setNaturalStackAlignment(16);
      cc.setPassedOrder(kKindGp, kZax, kZdx, kZcx, kZsi, kZdi);
      cc.setPassedOrder(kKindMm, 0, 1, 2, 3, 4, 5, 6, 7);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3, 4, 5, 6, 7);

      cc.setPreservedRegs(kKindGp , Utils::bits(8));
      cc.setPreservedRegs(kKindVec, Utils::bits(8) & ~Utils::bits(n));
      cc.setPreservedRegs(kKindMm , Utils::bits(8));
      cc.setPreservedRegs(kKindK  , Utils::bits(8));
      break;
    }

    case CallConv::kIdX64FastEval2:
    case CallConv::kIdX64FastEval3:
    case CallConv::kIdX64FastEval4: {
      uint32_t n = ccId - CallConv::kIdX64FastEval2;

      cc.setArchType(ArchInfo::kTypeX64);
      cc.setFlags(CallConv::kFlagPassFloatsByVec);
      cc.setNaturalStackAlignment(16);
      cc.setPassedOrder(kKindGp, kZax, kZdx, kZcx, kZsi, kZdi);
      cc.setPassedOrder(kKindMm, 0, 1, 2, 3, 4, 5, 6, 7);
      cc.setPassedOrder(kKindVec, 0, 1, 2, 3, 4, 5, 6, 7);

      cc.setPreservedRegs(kKindGp , Utils::bits(16));
      cc.setPreservedRegs(kKindVec,~Utils::bits(n));
      cc.setPreservedRegs(kKindMm , Utils::bits(8));
      cc.setPreservedRegs(kKindK  , Utils::bits(8));
      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidArgument);
  }

  cc.setId(ccId);
  return kErrorOk;
}